

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListAggregatesBind<false>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  ulong uVar1;
  LogicalTypeId LVar2;
  bool bVar3;
  pointer pEVar4;
  InvalidInputException *this;
  BinderException *this_00;
  AggregateFunctionCatalogEntry *pAVar5;
  size_type sVar6;
  undefined8 uVar7;
  string *psVar8;
  AggregateFunction *this_01;
  FunctionSet<duckdb::AggregateFunction> *this_02;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  AggregateFunction aggr_function;
  AggregateFunction best_function;
  optional_idx best_function_idx;
  FunctionBinder function_binder;
  idx_t i;
  vector<duckdb::LogicalType,_true> types;
  ErrorData error;
  AggregateFunctionCatalogEntry *func;
  string function_name;
  LogicalType child_type;
  bool is_parameter;
  LogicalType *in_stack_fffffffffffffa68;
  string *in_stack_fffffffffffffa70;
  string *in_stack_fffffffffffffa78;
  ClientContext *in_stack_fffffffffffffa80;
  Catalog *in_stack_fffffffffffffa88;
  allocator *paVar9;
  optional_idx in_stack_fffffffffffffa90;
  optional_idx *this_03;
  ScalarFunction *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  string *msg;
  LogicalType *in_stack_fffffffffffffbb8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_fffffffffffffd48;
  AggregateFunction *in_stack_fffffffffffffd50;
  LogicalType *in_stack_fffffffffffffd58;
  ScalarFunction *in_stack_fffffffffffffd60;
  ClientContext *in_stack_fffffffffffffd68;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  optional_idx local_1f0;
  FunctionBinder local_1e8 [16];
  ulong local_1d8;
  optional_idx local_1d0 [3];
  ErrorData local_1b8 [132];
  undefined4 local_134;
  LogicalType local_130 [24];
  LogicalType local_118 [24];
  optional_idx local_100;
  QueryErrorContext local_f8;
  undefined1 local_e9 [33];
  AggregateFunctionCatalogEntry *local_c8;
  allocator local_b9;
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  LogicalType local_70 [24];
  LogicalType local_58 [27];
  byte local_3d;
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffa70,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffa68);
  duckdb::BoundCastExpression::AddArrayCastToList(local_28,in_RSI,local_30);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffa70,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffa68);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xd6629f);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xd662ac);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffa70);
  LVar2 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  if (LVar2 == SQLNULL) {
    ListAggregatesBindFailure(in_stack_fffffffffffffac8);
  }
  else {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffa70);
    LVar2 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
    local_3d = LVar2 == UNKNOWN;
    duckdb::LogicalType::LogicalType(local_58);
    if ((local_3d & 1) == 0) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffa70);
      LVar2 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
      if (LVar2 != LIST) {
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)in_stack_fffffffffffffa70);
        LVar2 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
        if (LVar2 != MAP) {
          local_92 = 1;
          this = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_90,"First argument of list aggregate must be a list, map or array",
                     &local_91);
          duckdb::InvalidInputException::InvalidInputException(this,local_90);
          local_92 = 0;
          __cxa_throw(this,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
      }
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffa70);
      duckdb::ListType::GetChildType((LogicalType *)(pEVar4 + 0x38));
      LogicalType::operator=
                ((LogicalType *)in_stack_fffffffffffffa78,(LogicalType *)in_stack_fffffffffffffa70);
    }
    else {
      duckdb::LogicalType::LogicalType(local_70,ANY);
      LogicalType::operator=((LogicalType *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      duckdb::LogicalType::~LogicalType(local_70);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"histogram",&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    this_00 = (BinderException *)duckdb::Catalog::GetSystemCatalog((ClientContext *)local_10);
    msg = (string *)local_e9;
    params = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_e9 + 1),"main",(allocator *)msg);
    optional_idx::optional_idx(&local_100);
    QueryErrorContext::QueryErrorContext(&local_f8,local_100);
    pAVar5 = Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                       (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                        in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                        (QueryErrorContext)in_stack_fffffffffffffa90.index);
    std::__cxx11::string::~string((string *)(local_e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e9);
    local_c8 = pAVar5;
    if ((local_3d & 1) == 0) {
      duckdb::ErrorData::ErrorData(local_1b8);
      this_03 = local_1d0;
      vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xd66850);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 in_stack_fffffffffffffa80,(value_type *)in_stack_fffffffffffffa78);
      local_1d8 = 2;
      while( true ) {
        uVar1 = local_1d8;
        sVar6 = std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::size(local_20);
        if (sVar6 <= uVar1) break;
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffa70);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   in_stack_fffffffffffffa80,(value_type *)in_stack_fffffffffffffa78);
        local_1d8 = local_1d8 + 1;
      }
      duckdb::FunctionBinder::FunctionBinder(local_1e8,(ClientContext *)local_10);
      local_1f0.index =
           duckdb::FunctionBinder::BindFunction
                     ((string *)local_1e8,(AggregateFunctionSet *)(local_c8 + 0x20),local_c8 + 0x158
                      ,(ErrorData *)local_1d0);
      bVar3 = optional_idx::IsValid(&local_1f0);
      if (!bVar3) {
        uVar7 = __cxa_allocate_exception(0x10);
        paVar9 = &local_211;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,"No matching aggregate function\n%s",paVar9);
        psVar8 = ErrorData::Message_abi_cxx11_(local_1b8);
        std::__cxx11::string::string(local_238,(string *)psVar8);
        BinderException::BinderException<std::__cxx11::string>(this_00,msg,params);
        __cxa_throw(uVar7,&BinderException::typeinfo,BinderException::~BinderException);
      }
      this_01 = (AggregateFunction *)(local_c8 + 0x158);
      this_02 = (FunctionSet<duckdb::AggregateFunction> *)optional_idx::GetIndex(this_03);
      FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset(this_02,(idx_t)this_01);
      HistogramFun::GetHistogramUnorderedMap(in_stack_fffffffffffffbb8);
      ListAggregatesBindFunction<false>
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      local_134 = 1;
      AggregateFunction::~AggregateFunction(this_01);
      AggregateFunction::~AggregateFunction(this_01);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd66b69);
      ErrorData::~ErrorData((ErrorData *)this_01);
    }
    else {
      duckdb::LogicalType::LogicalType(local_118,UNKNOWN);
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffa70,
                 (size_type)in_stack_fffffffffffffa68);
      LogicalType::operator=((LogicalType *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      duckdb::LogicalType::~LogicalType(local_118);
      duckdb::LogicalType::LogicalType(local_130,SQLNULL);
      LogicalType::operator=((LogicalType *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      duckdb::LogicalType::~LogicalType(local_130);
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<std::default_delete<duckdb::FunctionData>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_134 = 1;
    }
    std::__cxx11::string::~string(local_b8);
    duckdb::LogicalType::~LogicalType(local_58);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListAggregatesBind(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	if (arguments[0]->return_type.id() == LogicalTypeId::SQLNULL) {
		return ListAggregatesBindFailure(bound_function);
	}

	bool is_parameter = arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN;
	LogicalType child_type;
	if (is_parameter) {
		child_type = LogicalType::ANY;
	} else if (arguments[0]->return_type.id() == LogicalTypeId::LIST ||
	           arguments[0]->return_type.id() == LogicalTypeId::MAP) {
		child_type = ListType::GetChildType(arguments[0]->return_type);
	} else {
		// Unreachable
		throw InvalidInputException("First argument of list aggregate must be a list, map or array");
	}

	string function_name = "histogram";
	if (IS_AGGR) { // get the name of the aggregate function
		if (!arguments[1]->IsFoldable()) {
			throw InvalidInputException("Aggregate function name must be a constant");
		}
		// get the function name
		Value function_value = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
		function_name = function_value.ToString();
	}

	// look up the aggregate function in the catalog
	auto &func = Catalog::GetSystemCatalog(context).GetEntry<AggregateFunctionCatalogEntry>(context, DEFAULT_SCHEMA,
	                                                                                        function_name);
	D_ASSERT(func.type == CatalogType::AGGREGATE_FUNCTION_ENTRY);

	if (is_parameter) {
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		return nullptr;
	}

	// find a matching aggregate function
	ErrorData error;
	vector<LogicalType> types;
	types.push_back(child_type);
	// push any extra arguments into the type list
	for (idx_t i = 2; i < arguments.size(); i++) {
		types.push_back(arguments[i]->return_type);
	}

	FunctionBinder function_binder(context);
	auto best_function_idx = function_binder.BindFunction(func.name, func.functions, types, error);
	if (!best_function_idx.IsValid()) {
		throw BinderException("No matching aggregate function\n%s", error.Message());
	}

	// found a matching function, bind it as an aggregate
	auto best_function = func.functions.GetFunctionByOffset(best_function_idx.GetIndex());
	if (IS_AGGR) {
		bound_function.errors = best_function.errors;
		return ListAggregatesBindFunction<IS_AGGR>(context, bound_function, child_type, best_function, arguments);
	}

	// create the unordered map histogram function
	D_ASSERT(best_function.arguments.size() == 1);
	auto aggr_function = HistogramFun::GetHistogramUnorderedMap(child_type);
	return ListAggregatesBindFunction<IS_AGGR>(context, bound_function, child_type, aggr_function, arguments);
}